

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O2

xmlGlobalStatePtr xmlGetThreadLocalStorage(int allowFailure)

{
  uint uVar1;
  xmlGlobalStatePtr __pointer;
  
  xmlInitParser();
  __pointer = (xmlGlobalStatePtr)pthread_getspecific(globalkey);
  if (__pointer == (xmlGlobalStatePtr)0x0) {
    __pointer = (xmlGlobalStatePtr)calloc(1,0xd0);
    if (__pointer == (xmlGlobalStatePtr)0x0) {
      if (allowFailure != 0) {
        return (xmlGlobalStatePtr)0x0;
      }
      xmlAbort(
              "libxml2: Failed to allocate globals for thread\nlibxml2: See xmlCheckThreadLocalStorage\n"
              );
    }
    uVar1 = xmlGlobalRandom();
    __pointer->localRngState[0] = uVar1;
    uVar1 = xmlGlobalRandom();
    __pointer->localRngState[1] = uVar1;
    xmlMutexLock(&xmlThrDefMutex);
    __pointer->doValidityCheckingDefaultValue = xmlDoValidityCheckingDefaultValueThrDef;
    __pointer->getWarningsDefaultValue = xmlGetWarningsDefaultValueThrDef;
    __pointer->keepBlanksDefaultValue = xmlKeepBlanksDefaultValueThrDef;
    __pointer->lineNumbersDefaultValue = xmlLineNumbersDefaultValueThrDef;
    __pointer->loadExtDtdDefaultValue = xmlLoadExtDtdDefaultValueThrDef;
    __pointer->pedanticParserDefaultValue = xmlPedanticParserDefaultValueThrDef;
    __pointer->substituteEntitiesDefaultValue = xmlSubstituteEntitiesDefaultValueThrDef;
    __pointer->indentTreeOutput = xmlIndentTreeOutputThrDef;
    __pointer->treeIndentString = xmlTreeIndentStringThrDef;
    __pointer->saveNoEmptyTags = xmlSaveNoEmptyTagsThrDef;
    __pointer->genericError = xmlGenericErrorThrDef;
    __pointer->structuredError = xmlStructuredErrorThrDef;
    __pointer->genericErrorContext = xmlGenericErrorContextThrDef;
    __pointer->structuredErrorContext = xmlStructuredErrorContextThrDef;
    __pointer->registerNodeDefaultValue = xmlRegisterNodeDefaultValueThrDef;
    __pointer->deregisterNodeDefaultValue = xmlDeregisterNodeDefaultValueThrDef;
    __pointer->parserInputBufferCreateFilenameValue = xmlParserInputBufferCreateFilenameValueThrDef;
    __pointer->outputBufferCreateFilenameValue = xmlOutputBufferCreateFilenameValueThrDef;
    xmlMutexUnlock(&xmlThrDefMutex);
    pthread_setspecific(globalkey,__pointer);
  }
  return __pointer;
}

Assistant:

static xmlGlobalStatePtr
xmlGetThreadLocalStorage(int allowFailure) {
    xmlGlobalState *gs;

    (void) allowFailure;

    xmlInitParser();

#ifdef USE_TLS
    gs = &globalState;
    if (gs->initialized == 0)
        xmlInitGlobalState(gs);
#elif defined(HAVE_POSIX_THREADS)
    gs = (xmlGlobalState *) pthread_getspecific(globalkey);
    if (gs == NULL)
        gs = xmlNewGlobalState(allowFailure);
#elif defined(HAVE_WIN32_THREADS)
    gs = (xmlGlobalState *) TlsGetValue(globalkey);
    if (gs == NULL)
        gs = xmlNewGlobalState(allowFailure);
#else
    gs = NULL;
#endif

    return(gs);
}